

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# laswriteitemcompressed_v4.cpp
# Opt level: O3

int __thiscall
LASwriteItemCompressed_BYTE14_v4::init(LASwriteItemCompressed_BYTE14_v4 *this,EVP_PKEY_CTX *ctx)

{
  U32 context;
  uint uVar1;
  ByteStreamOutArray **ppBVar2;
  ByteStreamOutArray *pBVar3;
  U8 *pUVar4;
  ArithmeticEncoder **ppAVar5;
  ArithmeticEncoder *this_00;
  long lVar6;
  undefined7 extraout_var;
  U32 *in_RDX;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  
  uVar8 = (ulong)this->number;
  if (this->outstream_Bytes == (ByteStreamOutArray **)0x0) {
    uVar7 = uVar8 * 8;
    ppBVar2 = (ByteStreamOutArray **)operator_new__(uVar7);
    this->outstream_Bytes = ppBVar2;
    if (uVar8 == 0) {
      ppAVar5 = (ArithmeticEncoder **)operator_new__(uVar7);
      this->enc_Bytes = ppAVar5;
      goto LAB_0013b04c;
    }
    uVar9 = 0;
    do {
      pBVar3 = (ByteStreamOutArray *)operator_new(0x40);
      (pBVar3->super_ByteStreamOut).bit_buffer = 0;
      (pBVar3->super_ByteStreamOut).num_buffer = 0;
      pUVar4 = (U8 *)malloc(0x1000);
      pBVar3->data = pUVar4;
      pBVar3->alloc = 0x1000;
      pBVar3->size = 0;
      pBVar3->curr = 0;
      (pBVar3->super_ByteStreamOut)._vptr_ByteStreamOut = (_func_int **)&PTR_putByte_0015d5b0;
      pBVar3[1].super_ByteStreamOut._vptr_ByteStreamOut = (_func_int **)0x0;
      this->outstream_Bytes[uVar9] = pBVar3;
      uVar9 = uVar9 + 1;
    } while (uVar8 != uVar9);
    ppAVar5 = (ArithmeticEncoder **)operator_new__(uVar7);
    this->enc_Bytes = ppAVar5;
    if (uVar8 == 0) goto LAB_0013b04c;
    uVar8 = 0;
    do {
      this_00 = (ArithmeticEncoder *)operator_new(0x30);
      ArithmeticEncoder::ArithmeticEncoder(this_00);
      this->enc_Bytes[uVar8] = this_00;
      uVar8 = uVar8 + 1;
      uVar1 = this->number;
    } while (uVar8 < uVar1);
  }
  else {
    if (uVar8 == 0) goto LAB_0013b04c;
    uVar8 = 0;
    do {
      (*(this->outstream_Bytes[uVar8]->super_ByteStreamOut)._vptr_ByteStreamOut[10])
                (this->outstream_Bytes[uVar8],0);
      uVar8 = uVar8 + 1;
      uVar1 = this->number;
    } while (uVar8 < uVar1);
  }
  if (uVar1 != 0) {
    uVar8 = 0;
    do {
      ArithmeticEncoder::init(this->enc_Bytes[uVar8],(EVP_PKEY_CTX *)this->outstream_Bytes[uVar8]);
      uVar8 = uVar8 + 1;
      uVar7 = (ulong)this->number;
    } while (uVar8 < uVar7);
    if (uVar7 != 0) {
      memset(this->changed_Bytes,0,uVar7);
    }
  }
LAB_0013b04c:
  lVar6 = 0x38;
  do {
    *(undefined1 *)((long)this->contexts + lVar6 + -0x38) = 1;
    lVar6 = lVar6 + 0x18;
  } while (lVar6 != 0x98);
  context = *in_RDX;
  this->current_context = context;
  createAndInitModelsAndCompressors(this,context,(U8 *)ctx);
  return (int)CONCAT71(extraout_var,1);
}

Assistant:

BOOL LASwriteItemCompressed_BYTE14_v4::init(const U8* item, U32& context)
{
  U32 i;

  /* on the first init create outstreams and encoders */

  if (outstream_Bytes == 0)
  {
    /* create outstreams pointer array */

    outstream_Bytes = new ByteStreamOutArray*[number];

    /* create outstreams */

    if (IS_LITTLE_ENDIAN())
    {
      for (i = 0; i < number; i++)
      {
        outstream_Bytes[i] = new ByteStreamOutArrayLE();
      }
    }
    else
    {
      for (i = 0; i < number; i++)
      {
        outstream_Bytes[i] = new ByteStreamOutArrayBE();
      }
    }

    /* create encoder pointer array */

    enc_Bytes = new ArithmeticEncoder*[number];

    /* create layer encoders */

    for (i = 0; i < number; i++)
    {
      enc_Bytes[i] = new ArithmeticEncoder();
    }
  }
  else
  {
    /* otherwise just seek back */

    for (i = 0; i < number; i++)
    {
      outstream_Bytes[i]->seek(0);
    }
  }
  
  /* init layer encoders */

  for (i = 0; i < number; i++)
  {
    enc_Bytes[i]->init(outstream_Bytes[i]);
  }

  /* set changed booleans to FALSE */

  for (i = 0; i < number; i++)
  {
    changed_Bytes[i] = FALSE;
  }

  /* mark the four scanner channel contexts as unused */

  U32 c;
  for (c = 0; c < 4; c++)
  {
    contexts[c].unused = TRUE;
  }

  /* set scanner channel as current context */

  current_context = context; // all other items use context set by POINT14 writer

  /* create and init entropy models and integer compressors (and init context from item)  */

  createAndInitModelsAndCompressors(current_context, item);

  return TRUE;
}